

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir_generator.cpp
# Opt level: O0

void __thiscall
front::irGenerator::irGenerator::ir_ref(irGenerator *this,LeftVal *dest,LeftVal *src,bool begin)

{
  LabelId LVar1;
  LabelId LVar2;
  irGenerator *this_00;
  variant_alternative_t<1UL,_variant<int,_basic_string<char>_>_> *_dest;
  byte in_CL;
  LeftVal *in_RDI;
  shared_ptr<mir::inst::Inst> refInst;
  LabelId id;
  shared_ptr<std::variant<mir::inst::VarId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  val;
  shared_ptr<mir::inst::VarId> destVarId;
  RefInst *in_stack_fffffffffffffe48;
  VarId *in_stack_fffffffffffffe50;
  string *in_stack_fffffffffffffe68;
  irGenerator *in_stack_fffffffffffffe70;
  variant<mir::inst::VarId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *_val;
  undefined4 in_stack_fffffffffffffe90;
  shared_ptr<mir::inst::RefInst> local_108 [2];
  undefined1 in_stack_ffffffffffffff27;
  shared_ptr<mir::inst::Inst> *in_stack_ffffffffffffff28;
  irGenerator *in_stack_ffffffffffffff30;
  string local_c8 [39];
  undefined1 local_a1;
  undefined1 local_68 [36];
  LabelId local_44;
  byte local_19;
  
  local_19 = in_CL & 1;
  std::shared_ptr<mir::inst::VarId>::shared_ptr((shared_ptr<mir::inst::VarId> *)0x25f4be);
  std::
  shared_ptr<std::variant<mir::inst::VarId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::shared_ptr((shared_ptr<std::variant<mir::inst::VarId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)0x25f4cb);
  std::shared_ptr<mir::inst::Inst>::shared_ptr((shared_ptr<mir::inst::Inst> *)0x25f4d8);
  this_00 = (irGenerator *)operator_new(0x10);
  local_a1 = 1;
  std::
  variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  variant((variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)in_stack_fffffffffffffe50,
          (variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)in_stack_fffffffffffffe48);
  LVar1 = LeftValueToLabelId(this_00,in_RDI);
  mir::inst::VarId::VarId
            (in_stack_fffffffffffffe50,(uint32_t)((ulong)in_stack_fffffffffffffe48 >> 0x20));
  local_a1 = 0;
  std::shared_ptr<mir::inst::VarId>::shared_ptr<mir::inst::VarId,void>
            ((shared_ptr<mir::inst::VarId> *)in_stack_fffffffffffffe50,
             (VarId *)in_stack_fffffffffffffe48);
  _val = (variant<mir::inst::VarId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *)local_68;
  std::shared_ptr<mir::inst::VarId>::operator=
            ((shared_ptr<mir::inst::VarId> *)in_stack_fffffffffffffe50,
             (shared_ptr<mir::inst::VarId> *)in_stack_fffffffffffffe48);
  std::shared_ptr<mir::inst::VarId>::~shared_ptr((shared_ptr<mir::inst::VarId> *)0x25f56d);
  std::
  variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~variant((variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            *)0x25f57a);
  _dest = std::get<1ul,int,std::__cxx11::string>
                    ((variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)0x25f584);
  std::__cxx11::string::string(local_c8,(string *)_dest);
  LVar2 = nameToLabelId(in_stack_fffffffffffffe70,in_stack_fffffffffffffe68);
  local_44 = LVar2;
  std::__cxx11::string::~string(local_c8);
  if (LVar2 < 0) {
    operator_new(0x28);
    std::get<1ul,int,std::__cxx11::string>
              ((variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)0x25f729);
    std::variant<mir::inst::VarId,std::__cxx11::string>::
    variant<std::__cxx11::string&,void,void,std::__cxx11::string,void>
              ((variant<mir::inst::VarId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)in_stack_fffffffffffffe50,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffe48);
    std::shared_ptr<std::variant<mir::inst::VarId,std::__cxx11::string>>::
    shared_ptr<std::variant<mir::inst::VarId,std::__cxx11::string>,void>
              ((shared_ptr<std::variant<mir::inst::VarId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)in_stack_fffffffffffffe50,
               (variant<mir::inst::VarId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)in_stack_fffffffffffffe48);
    std::
    shared_ptr<std::variant<mir::inst::VarId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator=((shared_ptr<std::variant<mir::inst::VarId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)in_stack_fffffffffffffe50,
                (shared_ptr<std::variant<mir::inst::VarId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)in_stack_fffffffffffffe48);
    std::
    shared_ptr<std::variant<mir::inst::VarId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~shared_ptr((shared_ptr<std::variant<mir::inst::VarId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)0x25f777);
  }
  else {
    operator_new(0x28);
    mir::inst::VarId::VarId
              (in_stack_fffffffffffffe50,(uint32_t)((ulong)in_stack_fffffffffffffe48 >> 0x20));
    std::variant<mir::inst::VarId,std::__cxx11::string>::
    variant<mir::inst::VarId,void,void,mir::inst::VarId,void>
              ((variant<mir::inst::VarId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)in_stack_fffffffffffffe50,(VarId *)in_stack_fffffffffffffe48);
    std::shared_ptr<std::variant<mir::inst::VarId,std::__cxx11::string>>::
    shared_ptr<std::variant<mir::inst::VarId,std::__cxx11::string>,void>
              ((shared_ptr<std::variant<mir::inst::VarId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)in_stack_fffffffffffffe50,
               (variant<mir::inst::VarId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)in_stack_fffffffffffffe48);
    std::
    shared_ptr<std::variant<mir::inst::VarId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator=((shared_ptr<std::variant<mir::inst::VarId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)in_stack_fffffffffffffe50,
                (shared_ptr<std::variant<mir::inst::VarId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)in_stack_fffffffffffffe48);
    std::
    shared_ptr<std::variant<mir::inst::VarId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~shared_ptr((shared_ptr<std::variant<mir::inst::VarId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)0x25f64b);
  }
  operator_new(0x40);
  std::__shared_ptr_access<mir::inst::VarId,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator*
            ((__shared_ptr_access<mir::inst::VarId,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             in_stack_fffffffffffffe50);
  mir::inst::VarId::VarId(in_stack_fffffffffffffe50,(VarId *)in_stack_fffffffffffffe48);
  std::
  __shared_ptr_access<std::variant<mir::inst::VarId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  ::operator*((__shared_ptr_access<std::variant<mir::inst::VarId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               *)in_stack_fffffffffffffe50);
  std::
  variant<mir::inst::VarId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::variant((variant<mir::inst::VarId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)in_stack_fffffffffffffe50,
            (variant<mir::inst::VarId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)in_stack_fffffffffffffe48);
  mir::inst::RefInst::RefInst
            ((RefInst *)CONCAT44(LVar1,in_stack_fffffffffffffe90),(VarId *)_dest,_val);
  std::shared_ptr<mir::inst::RefInst>::shared_ptr<mir::inst::RefInst,void>
            ((shared_ptr<mir::inst::RefInst> *)in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
  std::shared_ptr<mir::inst::Inst>::operator=
            ((shared_ptr<mir::inst::Inst> *)(local_68 + 0x10),local_108);
  std::shared_ptr<mir::inst::RefInst>::~shared_ptr((shared_ptr<mir::inst::RefInst> *)0x25f849);
  std::
  variant<mir::inst::VarId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~variant((variant<mir::inst::VarId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)0x25f853);
  insertInstruction(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,
                    (bool)in_stack_ffffffffffffff27);
  std::shared_ptr<mir::inst::Inst>::~shared_ptr((shared_ptr<mir::inst::Inst> *)0x25f87c);
  std::
  shared_ptr<std::variant<mir::inst::VarId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~shared_ptr((shared_ptr<std::variant<mir::inst::VarId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)0x25f889);
  std::shared_ptr<mir::inst::VarId>::~shared_ptr((shared_ptr<mir::inst::VarId> *)0x25f896);
  return;
}

Assistant:

void irGenerator::ir_ref(LeftVal dest, LeftVal src, bool begin) {
  shared_ptr<VarId> destVarId;
  shared_ptr<std::variant<VarId, std::string>> val;
  LabelId id;
  shared_ptr<mir::inst::Inst> refInst;

  destVarId = shared_ptr<VarId>(new VarId(LeftValueToLabelId(dest)));
  if ((id = nameToLabelId(get<1>(src))) >= 0) {
    val = shared_ptr<std::variant<VarId, std::string>>(
        new std::variant<VarId, std::string>(VarId(id)));
  } else {
    val = shared_ptr<std::variant<VarId, std::string>>(
        new std::variant<VarId, std::string>(get<1>(src)));
  }

  refInst =
      shared_ptr<mir::inst::RefInst>(new mir::inst::RefInst(*destVarId, *val));

  insertInstruction(refInst, begin);
}